

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Writer.cpp
# Opt level: O0

void __thiscall OSTEI_VRR_Writer::WriteVRR_Inline_(OSTEI_VRR_Writer *this,ostream *os,QAM *am)

{
  QAM *in_RDX;
  OSTEI_VRR_Algorithm_Base *in_RSI;
  string *in_stack_00000a70;
  VRR_StepSet *in_stack_00000a78;
  QAM *in_stack_00000a80;
  ostream *in_stack_00000a88;
  OSTEI_VRR_Writer *in_stack_00000a90;
  QAM *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  int in_stack_ffffffffffffff0c;
  string local_d8 [216];
  
  QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
           in_stack_fffffffffffffeb8);
  QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
           in_stack_fffffffffffffeb8);
  OSTEI_VRR_Algorithm_Base::GetSteps(in_RSI,in_RDX);
  QAM::QAM((QAM *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
           in_stack_fffffffffffffeb8);
  OSTEI_VRR_Algorithm_Base::GetMReq
            ((OSTEI_VRR_Algorithm_Base *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),in_stack_fffffffffffffeb8
            );
  std::__cxx11::to_string(in_stack_ffffffffffffff0c);
  WriteVRRSteps_(in_stack_00000a90,in_stack_00000a88,in_stack_00000a80,in_stack_00000a78,
                 in_stack_00000a70);
  std::__cxx11::string::~string(local_d8);
  QAM::~QAM((QAM *)0x141d56);
  std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>::~set
            ((set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_> *)0x141d63);
  QAM::~QAM((QAM *)0x141d70);
  QAM::~QAM((QAM *)0x141d7d);
  return;
}

Assistant:

void OSTEI_VRR_Writer::WriteVRR_Inline_(std::ostream & os, QAM am) const
{
    WriteVRRSteps_(os, am, vrr_algo_.GetSteps(am), 
                   std::to_string(vrr_algo_.GetMReq(am)+1));
}